

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O3

void ValidateRange(Range *range,int max_cyls,int max_heads,int cyl_step,int def_cyls,int def_heads)

{
  int iVar1;
  exception *this;
  int local_30;
  int local_2c;
  
  if (def_cyls < 1) {
    def_cyls = max_cyls;
  }
  if (def_heads < 1) {
    def_heads = max_heads;
  }
  if (1 < cyl_step) {
    def_cyls = (def_cyls + cyl_step + -1) / cyl_step;
    max_cyls = (cyl_step + max_cyls + -1) / cyl_step;
  }
  iVar1 = Range::cyls(range);
  if (iVar1 < 1) {
    range->cyl_begin = 0;
    range->cyl_end = def_cyls;
  }
  else {
    def_cyls = range->cyl_end;
  }
  if (max_cyls < def_cyls) {
    this = (exception *)__cxa_allocate_exception(0x10);
    local_2c = range->cyl_end + -1;
    local_30 = max_cyls + -1;
    util::exception::exception<char_const(&)[15],int,char_const(&)[19],int,char_const(&)[2]>
              (this,(char (*) [15])"end cylinder (",&local_2c,(char (*) [19])") out of range (0-",
               &local_30,(char (*) [2])0x1aefd0);
  }
  else {
    iVar1 = Range::heads(range);
    if (iVar1 < 1) {
      range->head_begin = 0;
      range->head_end = def_heads;
    }
    else {
      def_heads = range->head_end;
    }
    if (def_heads <= max_heads) {
      return;
    }
    this = (exception *)__cxa_allocate_exception(0x10);
    local_2c = range->head_end + -1;
    local_30 = max_heads + -1;
    util::exception::exception<char_const(&)[11],int,char_const(&)[19],int,char_const(&)[2]>
              (this,(char (*) [11])"end head (",&local_2c,(char (*) [19])") out of range (0-",
               &local_30,(char (*) [2])0x1aefd0);
  }
  __cxa_throw(this,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ValidateRange(Range& range, int max_cyls, int max_heads, int cyl_step/*=1*/, int def_cyls/*=0*/, int def_heads/*=0*/)
{
    // Default to the normal cyl/head limits
    if (def_cyls <= 0) def_cyls = max_cyls;
    if (def_heads <= 0) def_heads = max_heads;

    // Limit default according to step, rounding up
    if (cyl_step > 1)
    {
        def_cyls = (def_cyls + (cyl_step - 1)) / cyl_step;
        max_cyls = (max_cyls + (cyl_step - 1)) / cyl_step;
    }

    // Use default if unset
    if (range.cyls() <= 0)
    {
        range.cyl_begin = 0;
        range.cyl_end = def_cyls;
    }

    if (range.cyl_end > max_cyls)
        throw util::exception("end cylinder (", range.cyl_end - 1, ") out of range (0-", max_cyls - 1, ")");

    // If no head value is given, use the default range
    if (range.heads() <= 0)
    {
        range.head_begin = 0;
        range.head_end = def_heads;
    }

    if (range.head_end > max_heads)
        throw util::exception("end head (", range.head_end - 1, ") out of range (0-", max_heads - 1, ")");
}